

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O0

PHYSFS_ErrorCode szipErrorCode(SRes rc)

{
  PHYSFS_ErrorCode local_c;
  SRes rc_local;
  
  switch(rc) {
  case 0:
    local_c = PHYSFS_ERR_OK;
    break;
  case 1:
    local_c = PHYSFS_ERR_CORRUPT;
    break;
  case 2:
    local_c = PHYSFS_ERR_OUT_OF_MEMORY;
    break;
  case 3:
    local_c = PHYSFS_ERR_CORRUPT;
    break;
  case 4:
    local_c = PHYSFS_ERR_UNSUPPORTED;
    break;
  default:
    local_c = PHYSFS_ERR_OTHER_ERROR;
    break;
  case 6:
    local_c = PHYSFS_ERR_CORRUPT;
    break;
  case 7:
    local_c = PHYSFS_ERR_IO;
    break;
  case 8:
    local_c = PHYSFS_ERR_IO;
    break;
  case 9:
    local_c = PHYSFS_ERR_IO;
    break;
  case 0x10:
    local_c = PHYSFS_ERR_CORRUPT;
    break;
  case 0x11:
    local_c = PHYSFS_ERR_UNSUPPORTED;
  }
  return local_c;
}

Assistant:

static PHYSFS_ErrorCode szipErrorCode(const SRes rc)
{
    switch (rc)
    {
        case SZ_OK: return PHYSFS_ERR_OK;
        case SZ_ERROR_DATA: return PHYSFS_ERR_CORRUPT;
        case SZ_ERROR_MEM: return PHYSFS_ERR_OUT_OF_MEMORY;
        case SZ_ERROR_CRC: return PHYSFS_ERR_CORRUPT;
        case SZ_ERROR_UNSUPPORTED: return PHYSFS_ERR_UNSUPPORTED;
        case SZ_ERROR_INPUT_EOF: return PHYSFS_ERR_CORRUPT;
        case SZ_ERROR_OUTPUT_EOF: return PHYSFS_ERR_IO;
        case SZ_ERROR_READ: return PHYSFS_ERR_IO;
        case SZ_ERROR_WRITE: return PHYSFS_ERR_IO;
        case SZ_ERROR_ARCHIVE: return PHYSFS_ERR_CORRUPT;
        case SZ_ERROR_NO_ARCHIVE: return PHYSFS_ERR_UNSUPPORTED;
        default: break;
    } /* switch */

    return PHYSFS_ERR_OTHER_ERROR;
}